

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_spawn(Executor *this,size_t N)

{
  anon_class_16_2_94731f89 __p;
  __pthread_internal_list *p_Var1;
  __pthread_internal_list *p_Var2;
  reference pvVar3;
  reference pvVar4;
  vector<tf::Worker,_std::allocator<tf::Worker>_> *this_00;
  undefined1 local_c8 [8];
  unique_lock<std::mutex> lock;
  reference_wrapper<unsigned_long> local_a8;
  reference_wrapper<std::condition_variable> local_a0;
  reference_wrapper<std::mutex> local_98;
  reference_wrapper<tf::Worker> local_90;
  type local_88;
  __pthread_internal_list *local_80;
  size_t id;
  size_t n;
  condition_variable cond;
  undefined1 local_40 [8];
  mutex mutex;
  size_t N_local;
  Executor *this_local;
  
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)N;
  std::mutex::mutex((mutex *)local_40);
  std::condition_variable::condition_variable((condition_variable *)&n);
  id = 0;
  for (local_80 = (__pthread_internal_list *)0x0; p_Var1 = local_80,
      local_80 < mutex.super___mutex_base._M_mutex.__data.__list.__next;
      local_80 = (__pthread_internal_list *)((long)&local_80->__prev + 1)) {
    this_00 = &this->_workers;
    pvVar3 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (this_00,(size_type)local_80);
    p_Var2 = local_80;
    pvVar3->_id = (size_t)p_Var1;
    pvVar3 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (this_00,(size_type)local_80);
    pvVar3->_vtm = (size_t)p_Var2;
    pvVar3 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (this_00,(size_type)local_80);
    pvVar3->_executor = this;
    pvVar4 = std::vector<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>::operator[]
                       (&(this->_notifier)._waiters,(size_type)local_80);
    pvVar3 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (this_00,(size_type)local_80);
    pvVar3->_waiter = pvVar4;
    local_88.this = this;
    pvVar3 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (this_00,(size_type)local_80);
    local_90 = std::ref<tf::Worker>(pvVar3);
    local_98 = std::ref<std::mutex>((mutex *)local_40);
    local_a0 = std::ref<std::condition_variable>((condition_variable *)&n);
    local_a8 = std::ref<unsigned_long>(&id);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<tf::Executor::_spawn(unsigned_long)::_lambda(tf::Worker&,std::mutex&,std::condition_variable&,unsigned_long&)_1_,std::reference_wrapper<tf::Worker>,std::reference_wrapper<std::mutex>,std::reference_wrapper<std::condition_variable>,std::reference_wrapper<unsigned_long>>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->_threads,&local_88,
               &local_90,&local_98,&local_a0,&local_a8);
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_c8,(mutex_type *)local_40);
  __p.N = (size_t *)((long)&mutex.super___mutex_base._M_mutex + 0x20);
  __p.n = &id;
  std::condition_variable::wait<tf::Executor::_spawn(unsigned_long)::_lambda()_1_>
            ((condition_variable *)&n,(unique_lock<std::mutex> *)local_c8,__p);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
  std::condition_variable::~condition_variable((condition_variable *)&n);
  return;
}

Assistant:

inline void Executor::_spawn(size_t N) {

  std::mutex mutex;
  std::condition_variable cond;
  size_t n=0;

  for(size_t id=0; id<N; ++id) {

    _workers[id]._id = id;
    _workers[id]._vtm = id;
    _workers[id]._executor = this;
    _workers[id]._waiter = &_notifier._waiters[id];

    _threads.emplace_back([this] (
      Worker& w, std::mutex& mutex, std::condition_variable& cond, size_t& n
    ) -> void {

      // enables the mapping
      {
        std::scoped_lock lock(mutex);
        _wids[std::this_thread::get_id()] = w._id;
        if(n++; n == num_workers()) {
          cond.notify_one();
        }
      }

      //this_worker().worker = &w;

      Node* t = nullptr;

      // must use 1 as condition instead of !done
      while(1) {

        // execute the tasks.
        _exploit_task(w, t);

        // wait for tasks
        if(_wait_for_task(w, t) == false) {
          break;
        }
      }

    }, std::ref(_workers[id]), std::ref(mutex), std::ref(cond), std::ref(n));
  }

  std::unique_lock<std::mutex> lock(mutex);
  cond.wait(lock, [&](){ return n==N; });
}